

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O2

int * Pdr_ManSortByPriority(Pdr_Man_t *p,Pdr_Set_t *pCube)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  
  piVar3 = p->pOrder;
  piVar4 = p->vPrio->pArray;
  uVar1 = pCube->nLits;
  uVar7 = 0;
  uVar8 = 0;
  if (0 < (int)uVar1) {
    uVar8 = (ulong)uVar1;
  }
  for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    piVar3[uVar7] = (int)uVar7;
  }
  uVar6 = 1;
  if (1 < (int)uVar1) {
    uVar6 = uVar1;
  }
  lVar9 = 1;
  for (uVar7 = 0; uVar7 != uVar6 - 1; uVar7 = uVar7 + 1) {
    uVar8 = uVar7 & 0xffffffff;
    lVar10 = lVar9;
    while( true ) {
      uVar11 = (uint)uVar8;
      if ((int)uVar1 <= (int)(uint)lVar10) break;
      uVar5 = (uint)lVar10;
      if (piVar4[*(int *)(&pCube->field_0x14 + (long)piVar3[(int)uVar11] * 4) >> 1] <=
          piVar4[*(int *)(&pCube->field_0x14 + (long)piVar3[lVar10] * 4) >> 1]) {
        uVar5 = uVar11;
      }
      lVar10 = lVar10 + 1;
      uVar8 = (ulong)uVar5;
    }
    iVar2 = piVar3[uVar7];
    piVar3[uVar7] = piVar3[(int)uVar11];
    piVar3[(int)uVar11] = iVar2;
    lVar9 = lVar9 + 1;
  }
  return piVar3;
}

Assistant:

int * Pdr_ManSortByPriority( Pdr_Man_t * p, Pdr_Set_t * pCube )
{
    int * pPrios = Vec_IntArray(p->vPrio);
    int * pArray = p->pOrder;
    int temp, i, j, best_i, nSize = pCube->nLits;
    // initialize variable order
    for ( i = 0; i < nSize; i++ )
        pArray[i] = i;
    for ( i = 0; i < nSize-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nSize; j++ )
//            if ( pArray[j] < pArray[best_i] )
            if ( pPrios[pCube->Lits[pArray[j]]>>1] < pPrios[pCube->Lits[pArray[best_i]]>>1] ) // list lower priority first (these will be removed first)
                best_i = j;
        temp = pArray[i];
        pArray[i] = pArray[best_i];
        pArray[best_i] = temp;
    }
/*
    for ( i = 0; i < pCube->nLits; i++ )
        Abc_Print( 1, "%2d : %5d    %5d  %5d\n", i, pArray[i], pCube->Lits[pArray[i]]>>1, pPrios[pCube->Lits[pArray[i]]>>1] );
    Abc_Print( 1, "\n" );
*/
    return pArray;
}